

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approx_count.cpp
# Opt level: O3

AggregateFunction *
duckdb::GetApproxCountDistinctFunction
          (AggregateFunction *__return_storage_ptr__,LogicalType *input_type)

{
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_59;
  LogicalType local_58;
  vector<duckdb::LogicalType,_true> local_40;
  LogicalType local_28;
  
  LogicalType::LogicalType(&local_28,input_type);
  __l._M_len = 1;
  __l._M_array = &local_28;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_40,__l,
             &local_59);
  LogicalType::LogicalType(&local_58,BIGINT);
  AggregateFunction::AggregateFunction
            (__return_storage_ptr__,&local_40,&local_58,
             AggregateFunction::StateSize<duckdb::ApproxDistinctCountState>,
             AggregateFunction::
             StateInitialize<duckdb::ApproxDistinctCountState,duckdb::ApproxCountDistinctFunction,(duckdb::AggregateDestructorType)0>
             ,ApproxCountDistinctUpdateFunction,
             AggregateFunction::
             StateCombine<duckdb::ApproxDistinctCountState,duckdb::ApproxCountDistinctFunction>,
             AggregateFunction::
             StateFinalize<duckdb::ApproxDistinctCountState,long,duckdb::ApproxCountDistinctFunction>
             ,ApproxCountDistinctSimpleUpdateFunction,(bind_aggregate_function_t)0x0,
             (aggregate_destructor_t)0x0,(aggregate_statistics_t)0x0,(aggregate_window_t)0x0,
             (aggregate_serialize_t)0x0,(aggregate_deserialize_t)0x0);
  LogicalType::~LogicalType(&local_58);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_40);
  LogicalType::~LogicalType(&local_28);
  (__return_storage_ptr__->super_BaseScalarFunction).null_handling = SPECIAL_HANDLING;
  return __return_storage_ptr__;
}

Assistant:

AggregateFunction GetApproxCountDistinctFunction(const LogicalType &input_type) {
	auto fun = AggregateFunction(
	    {input_type}, LogicalTypeId::BIGINT, AggregateFunction::StateSize<ApproxDistinctCountState>,
	    AggregateFunction::StateInitialize<ApproxDistinctCountState, ApproxCountDistinctFunction>,
	    ApproxCountDistinctUpdateFunction,
	    AggregateFunction::StateCombine<ApproxDistinctCountState, ApproxCountDistinctFunction>,
	    AggregateFunction::StateFinalize<ApproxDistinctCountState, int64_t, ApproxCountDistinctFunction>,
	    ApproxCountDistinctSimpleUpdateFunction);
	fun.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	return fun;
}